

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaggeredGrid.h
# Opt level: O2

void __thiscall
Field<unsigned_long,_unsigned_short>::Field
          (Field<unsigned_long,_unsigned_short> *this,unsigned_short Xsize,unsigned_short Ysize,
          unsigned_short Zsize)

{
  pointer puVar1;
  pointer pCVar2;
  int iVar3;
  ulong uVar4;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  undefined6 in_register_00000032;
  ulong uVar5;
  
  (this->_label).super__Vector_base<CellLabel,_std::allocator<CellLabel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_label).super__Vector_base<CellLabel,_std::allocator<CellLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_label).super__Vector_base<CellLabel,_std::allocator<CellLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_Xsize = Xsize;
  this->_Ysize = Ysize;
  iVar3 = 1;
  if (Config::dim != 2) {
    iVar3 = (int)CONCAT62(in_register_0000000a,Zsize);
  }
  this->_Zsize = (unsigned_short)iVar3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_grid,
             (ulong)(uint)((int)CONCAT62(in_register_00000032,Xsize) *
                           (int)CONCAT62(in_register_00000012,Ysize) * iVar3));
  std::vector<CellLabel,_std::allocator<CellLabel>_>::resize
            (&this->_label,(ulong)((uint)this->_Zsize * (uint)this->_Ysize * (uint)this->_Xsize));
  uVar4 = (ulong)((uint)this->_Zsize * (uint)this->_Ysize * (uint)this->_Xsize);
  puVar1 = (this->_grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (this->_label).super__Vector_base<CellLabel,_std::allocator<CellLabel>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    puVar1[uVar5] = 0;
    pCVar2[uVar5] = EMPTY;
  }
  this->_maxIt = uVar4;
  return;
}

Assistant:

explicit Field(U Xsize, U Ysize, U Zsize)
        : _Xsize(Xsize)
        , _Ysize(Ysize)
        , _Zsize(Zsize)
    {
        if (Config::dim == 2)
        {
            _Zsize = 1;
        }
        _grid.resize(_Xsize*_Ysize*_Zsize);
        _label.resize(_Xsize*_Ysize*_Zsize);
        for (std::uint64_t it = 0; it < _Xsize*_Ysize*_Zsize; ++it)
        {
            _grid[it] = 0;
            _label[it] = EMPTY;
        }
        _maxIt = _Xsize*_Ysize*_Zsize;
    }